

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

void project_monster_handler_DISEN(project_monster_handler_context_t *context)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  project_monster_handler_context_t *context_local;
  
  project_monster_resist_other(context,L'Y',L'\x03',true,MON_MSG_RESIST);
  _Var1 = flag_has_dbg(context->mon->race->flags,0xc,0x59,"context->mon->race->flags","RF_IM_DISEN")
  ;
  if ((!_Var1) && (_Var1 = monster_has_non_innate_spells(context->mon), _Var1)) {
    uVar2 = Rand_div(10);
    wVar3 = adjust_radius(context,uVar2 + L'\x06');
    context->mon_timed[7] = wVar3;
  }
  return;
}

Assistant:

static void project_monster_handler_DISEN(project_monster_handler_context_t *context)
{
	project_monster_resist_other(context, RF_IM_DISEN, 3, true, MON_MSG_RESIST);

	/* Affect monsters which don't resist, and have non-innate spells */
	if (!rf_has(context->mon->race->flags, RF_IM_DISEN) &&
		monster_has_non_innate_spells(context->mon)) {
		context->mon_timed[MON_TMD_DISEN] = adjust_radius(context,
														  5 + randint1(10));
	}
}